

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecCall(Parser *this)

{
  line_t *plVar1;
  TokenType TVar2;
  pointer pcVar3;
  _func_int **pp_Var4;
  _Alloc_hider _Var5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  _func_int **pp_Var9;
  FieldExpr *this_00;
  ParseError *__return_storage_ptr__;
  long *plVar10;
  CompileContext *pCVar11;
  Parser *in_RSI;
  pointer *__ptr;
  Token paren;
  vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
  args;
  Token dot;
  Token name;
  undefined1 local_120 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_108;
  line_t local_f8;
  col_t local_f4;
  _Head_base<0UL,_enact::Expr_*,_false> local_f0;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  _Alloc_hider local_d8;
  undefined1 local_d0 [24];
  vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
  local_b8;
  undefined1 local_98 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_90;
  undefined1 local_88 [16];
  __node_base_ptr p_Stack_78;
  TokenType local_70;
  col_t local_6c;
  undefined1 local_60 [8];
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  line_t local_38;
  col_t local_34;
  
  parsePrecPrimary(this);
  plVar1 = &(in_RSI->m_previous).line;
  local_f0._M_head_impl = (Expr *)this;
  while( true ) {
    while( true ) {
      TVar2 = (in_RSI->m_current).type;
      if (TVar2 != DOT) break;
      advance(in_RSI);
      local_98._0_4_ = (in_RSI->m_previous).type;
      paStack_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_88 + 8);
      pcVar3 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&paStack_90,pcVar3,pcVar3 + (in_RSI->m_previous).lexeme._M_string_length)
      ;
      local_6c = (in_RSI->m_previous).col;
      local_70 = *plVar1;
      local_120._0_8_ = local_120 + 0x10;
      local_e8 = (undefined1  [8])0x21;
      local_120._0_8_ = std::__cxx11::string::_M_create((ulong *)local_120,(ulong)local_e8);
      local_120._16_8_ = local_e8;
      (((CompileContext *)local_120._0_8_)->m_source).field_2._M_allocated_capacity =
           0x6120656d616e2079;
      builtin_strncpy((char *)((long)&(((CompileContext *)local_120._0_8_)->m_source).field_2 + 8),
                      "fter \'.\'",8);
      (((CompileContext *)local_120._0_8_)->m_source)._M_dataplus._M_p = (pointer)0x6465746365707845
      ;
      (((CompileContext *)local_120._0_8_)->m_source)._M_string_length = 0x747265706f727020;
      *(undefined1 *)&(((CompileContext *)local_120._0_8_)->m_options).m_filename._M_dataplus._M_p =
           0x2e;
      local_120._8_8_ = local_e8;
      *(char *)((long)local_e8 + (long)&((CompileContext *)local_120._0_8_)->m_source) = '\0';
      expect(in_RSI,IDENTIFIER,(string *)local_120);
      if ((CompileContext *)local_120._0_8_ != (CompileContext *)(local_120 + 0x10)) {
        operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
      }
      local_60._0_4_ = (in_RSI->m_previous).type;
      local_58._0_8_ = &local_48;
      pcVar3 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar3,pcVar3 + (in_RSI->m_previous).lexeme._M_string_length);
      local_34 = (in_RSI->m_previous).col;
      local_38 = *plVar1;
      this_00 = (FieldExpr *)operator_new(0x70);
      local_b8.
      super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)this;
      this->m_context = 0;
      local_120._0_4_ = local_60._0_4_;
      local_120._8_8_ = &aStack_108;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ == &local_48) {
        aStack_108._8_8_ = local_48._8_8_;
      }
      else {
        local_120._8_8_ = local_58._0_8_;
      }
      aStack_108._M_allocated_capacity._1_7_ = local_48._1_7_;
      aStack_108._M_local_buf[0] = local_48._M_local_buf[0];
      local_120._16_8_ = local_58._8_8_;
      local_58._8_8_ = 0;
      local_48._M_local_buf[0] = '\0';
      local_f4 = (in_RSI->m_previous).col;
      local_f8 = *plVar1;
      local_e8._0_4_ = local_98._0_4_;
      if (paStack_90 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_88 + 8)) {
        local_d0._8_8_ = p_Stack_78;
        local_e0._M_p = (pointer)local_d0;
      }
      else {
        local_e0._M_p = (pointer)paStack_90;
      }
      local_d0._1_7_ = local_88._9_7_;
      local_d0[0] = local_88[8];
      local_d8._M_p = (pointer)local_88._0_8_;
      local_88._0_8_ = (pointer)0x0;
      local_88[8] = '\0';
      local_d0._20_2_ = local_6c;
      local_d0._16_4_ = local_70;
      paStack_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_88 + 8);
      local_58._0_8_ = &local_48;
      FieldExpr::FieldExpr
                (this_00,(unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)&local_b8,
                 (Token *)local_120,(Token *)local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0) {
        operator_delete(local_e0._M_p,(ulong)(local_d0._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._8_8_ != &aStack_108) {
        operator_delete((void *)local_120._8_8_,aStack_108._M_allocated_capacity + 1);
      }
      if (local_b8.
          super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)((local_b8.
                    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                  super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
                  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
                  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl[1]._vptr_Expr)();
      }
      *(FieldExpr **)this = this_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &local_48) {
        operator_delete((void *)local_58._0_8_,CONCAT71(local_48._1_7_,local_48._M_local_buf[0]) + 1
                       );
      }
      if (paStack_90 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_88 + 8)) {
        operator_delete(paStack_90,CONCAT71(local_88._9_7_,local_88[8]) + 1);
      }
    }
    if (TVar2 != LEFT_PAREN) break;
    advance(in_RSI);
    local_b8.
    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((in_RSI->m_current).type != RIGHT_PAREN) {
      while( true ) {
        parseExpr((Parser *)local_120);
        std::
        vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
        ::emplace_back<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>
                  ((vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
                    *)&local_b8,
                   (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_120);
        if ((CompileContext *)local_120._0_8_ != (CompileContext *)0x0) {
          (**(code **)(*(long *)local_120._0_8_ + 8))();
        }
        if ((in_RSI->m_current).type != COMMA) break;
        advance(in_RSI);
      }
    }
    local_120._0_8_ = local_120 + 0x10;
    local_e8 = (undefined1  [8])0x2b;
    local_120._0_8_ = std::__cxx11::string::_M_create((ulong *)local_120,(ulong)local_e8);
    local_120._16_8_ = local_e8;
    builtin_strncpy((char *)((long)&(((CompileContext *)local_120._0_8_)->m_source).field_2 + 0xb),
                    " call ar",8);
    builtin_strncpy((char *)((long)&(((CompileContext *)local_120._0_8_)->m_options).m_filename.
                                    _M_dataplus._M_p + 3),"guments.",8);
    (((CompileContext *)local_120._0_8_)->m_source).field_2._M_allocated_capacity =
         0x74636e7566207265;
    builtin_strncpy((char *)((long)&(((CompileContext *)local_120._0_8_)->m_source).field_2 + 8),
                    "ion call",8);
    (((CompileContext *)local_120._0_8_)->m_source)._M_dataplus._M_p = (pointer)0x6465746365707845;
    (((CompileContext *)local_120._0_8_)->m_source)._M_string_length = 0x7466612027292720;
    local_120._8_8_ = local_e8;
    *(char *)((long)local_e8 + (long)&((CompileContext *)local_120._0_8_)->m_source) = '\0';
    expect(in_RSI,RIGHT_PAREN,(string *)local_120);
    if ((CompileContext *)local_120._0_8_ != (CompileContext *)(local_120 + 0x10)) {
      operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
    }
    local_e8._0_4_ = (in_RSI->m_previous).type;
    pcVar3 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
    local_e0._M_p = (pointer)local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_e8 + 8),pcVar3,pcVar3 + (in_RSI->m_previous).lexeme._M_string_length
              );
    puVar7 = local_b8.
             super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar6 = local_b8.
             super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_d0._20_2_ = (in_RSI->m_previous).col;
    local_d0._16_4_ = *plVar1;
    if (0x7f8 < (ulong)((long)local_b8.
                              super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_b8.
                             super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)) {
      __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string
                ((string *)local_60,
                 (long)local_b8.
                       super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_b8.
                       super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     "Too many arguments in function call; ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      plVar10 = (long *)std::__cxx11::string::append(local_98);
      local_120._0_8_ = *plVar10;
      pCVar11 = (CompileContext *)(plVar10 + 2);
      if ((CompileContext *)local_120._0_8_ == pCVar11) {
        local_120._16_8_ = (pCVar11->m_source)._M_dataplus._M_p;
        aStack_108._M_allocated_capacity = plVar10[3];
        local_120._0_8_ = (CompileContext *)(local_120 + 0x10);
      }
      else {
        local_120._16_8_ = (pCVar11->m_source)._M_dataplus._M_p;
      }
      local_120._8_8_ = plVar10[1];
      *plVar10 = (long)pCVar11;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      errorAt(__return_storage_ptr__,in_RSI,(Token *)local_e8,(string *)local_120);
      __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    pp_Var9 = (_func_int **)operator_new(0x58);
    puVar8 = local_b8.
             super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    aStack_108._M_allocated_capacity = local_d0._0_8_;
    _Var5._M_p = local_d8._M_p;
    this = (Parser *)local_f0._M_head_impl;
    pp_Var4 = (local_f0._M_head_impl)->_vptr_Expr;
    (local_f0._M_head_impl)->_vptr_Expr = (_func_int **)0x0;
    local_b8.
    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_120._0_4_ = local_e8._0_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0) {
      local_e0._M_p = (pointer)&aStack_108;
      aStack_108._8_8_ = local_d0._8_8_;
    }
    local_120._8_8_ = &aStack_108;
    local_d8._M_p = (pointer)0x0;
    local_d0._0_8_ = local_d0._0_8_ & 0xffffffffffffff00;
    local_f4 = (in_RSI->m_previous).col;
    local_f8 = *plVar1;
    *pp_Var9 = (_func_int *)&PTR__CallExpr_00127648;
    pp_Var9[1] = (_func_int *)pp_Var4;
    pp_Var9[2] = (_func_int *)puVar6;
    pp_Var9[3] = (_func_int *)puVar7;
    pp_Var9[4] = (_func_int *)puVar8;
    local_88._0_8_ = (pointer)0x0;
    local_98 = (undefined1  [8])0x0;
    paStack_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
    *(undefined4 *)(pp_Var9 + 5) = local_e8._0_4_;
    pp_Var9[6] = (_func_int *)(pp_Var9 + 8);
    if (local_e0._M_p == (pointer)local_120._8_8_) {
      pp_Var9[8] = (_func_int *)aStack_108._M_allocated_capacity;
      pp_Var9[9] = (_func_int *)aStack_108._8_8_;
    }
    else {
      pp_Var9[6] = (_func_int *)local_e0._M_p;
      pp_Var9[8] = (_func_int *)aStack_108._M_allocated_capacity;
    }
    pp_Var9[7] = (_func_int *)_Var5._M_p;
    local_120._16_8_ = 0;
    aStack_108._M_allocated_capacity = aStack_108._M_allocated_capacity & 0xffffffffffffff00;
    *(col_t *)((long)pp_Var9 + 0x54) = (in_RSI->m_previous).col;
    *(line_t *)(pp_Var9 + 10) = *plVar1;
    local_e0._M_p = (pointer)local_d0;
    std::
    vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ::~vector((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
               *)local_98);
    ((Expr *)this)->_vptr_Expr = pp_Var9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0) {
      operator_delete(local_e0._M_p,(ulong)(local_d0._0_8_ + 1));
    }
    std::
    vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ::~vector(&local_b8);
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecCall() {
        std::unique_ptr<Expr> expr = parsePrecPrimary();

        while (true) {
            if (consume(TokenType::LEFT_PAREN)) {
                std::vector<std::unique_ptr<Expr>> args;
                if (!check(TokenType::RIGHT_PAREN)) {
                    do {
                        args.push_back(parseExpr());
                    } while (consume(TokenType::COMMA));
                }

                expect(TokenType::RIGHT_PAREN, "Expected ')' after function call arguments.");
                Token paren = m_previous;

                if (args.size() > 255) {
                    throw errorAt(paren,
                            "Too many arguments in function call; " +
                            std::to_string(args.size()) +
                            " were provided, max is 255.");
                }

                expr = std::make_unique<CallExpr>(std::move(expr), std::move(args), std::move(paren));
            } else if (consume(TokenType::DOT)) {
                Token dot = m_previous;

                expect(TokenType::IDENTIFIER, "Expected property name after '.'.");
                Token name = m_previous;

                expr = std::make_unique<FieldExpr>(std::move(expr), std::move(name), std::move(dot));
            } else {
                break;
            }
        }

        return expr;
    }